

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorUtil.h
# Opt level: O0

void jaegertracing::utils::ErrorUtil::logError(Logger *logger,string *message)

{
  ostringstream oss_1;
  Exception *ex;
  ostringstream oss;
  system_error *ex_1;
  ostringstream oss_2;
  exception *ex_2;
  string *message_local;
  Logger *logger_local;
  
  __cxa_rethrow();
  std::__shared_ptr_access<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::_M_get((__shared_ptr_access<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)logger);
  return;
}

Assistant:

inline void logError(logging::Logger& logger, const std::string& message)
{
    try {
        throw;
    } catch (const Sender::Exception& ex) {
        std::ostringstream oss;
        oss << message << ": " << ex.what() << ", numFailed=" << ex.numFailed();
        logger.error(oss.str());
    } catch (const std::system_error& ex) {
        std::ostringstream oss;
        oss << message << ": " << ex.what() << ", code=" << ex.code().value();
        logger.error(oss.str());
    } catch (const std::exception& ex) {
        std::ostringstream oss;
        oss << message << ": " << ex.what();
        logger.error(oss.str());
    } catch (...) {
        logger.error(message);
    }
}